

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool google::protobuf::compiler::js::anon_unknown_0::HasExtensions(Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = *(int *)(desc + 0x7c);
  if (0 < iVar2) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      if ((*(byte *)(*(long *)(desc + 0x50) + 1 + lVar3) & 8) != 0) {
        bVar1 = IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x50) + lVar3));
        if (!bVar1) {
          return true;
        }
        iVar2 = *(int *)(desc + 0x7c);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar4 < iVar2);
  }
  if (*(int *)(desc + 0x70) < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      bVar1 = HasExtensions((Descriptor *)(*(long *)(desc + 0x38) + lVar3));
      if (bVar1) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar4 < *(int *)(desc + 0x70));
  }
  return bVar1;
}

Assistant:

bool HasExtensions(const Descriptor* desc) {
  for (int i = 0; i < desc->extension_count(); i++) {
    if (ShouldGenerateExtension(desc->extension(i))) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); i++) {
    if (HasExtensions(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}